

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O1

const_iterator __thiscall
tsl::detail_robin_hash::
robin_hash<std::pair<std::__cxx11::wstring,unsigned_int>,tsl::robin_map<std::__cxx11::wstring,unsigned_int,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<std::__cxx11::wstring,unsigned_int,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
::find_impl<std::__cxx11::wstring>
          (robin_hash<std::pair<std::__cxx11::wstring,unsigned_int>,tsl::robin_map<std::__cxx11::wstring,unsigned_int,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<std::__cxx11::wstring,unsigned_int,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring,unsigned_int>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
           *this,basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *key,
          size_t hash)

{
  ulong uVar1;
  long lVar2;
  wchar_t *__s2;
  size_t sVar3;
  size_t __n;
  int iVar4;
  ulong uVar5;
  short sVar6;
  long lVar7;
  iterator_bucket iVar8;
  
  uVar1 = *(ulong *)this;
  lVar2 = *(long *)(this + 8);
  uVar5 = hash & uVar1;
  lVar7 = uVar5 * 0x30;
  if (-1 < *(short *)(lVar2 + 4 + lVar7)) {
    __s2 = (key->_M_dataplus)._M_p;
    sVar3 = key->_M_string_length;
    sVar6 = 0;
    do {
      iVar8._M_current =
           (bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>
            *)(lVar7 + lVar2);
      __n = *(size_t *)((long)&(iVar8._M_current)->m_value + 8);
      if (__n == sVar3) {
        if (__n == 0) {
          return (const_iterator)(iterator_bucket)iVar8._M_current;
        }
        iVar4 = wmemcmp((wchar_t *)((iVar8._M_current)->m_value).__align,__s2,__n);
        if (iVar4 == 0) {
          return (const_iterator)(iterator_bucket)iVar8._M_current;
        }
      }
      sVar6 = sVar6 + 1;
      uVar5 = uVar5 + 1 & uVar1;
      lVar7 = uVar5 * 0x30;
    } while (sVar6 <= *(short *)(lVar2 + 4 + lVar7));
  }
  return (const_iterator)
         (iterator_bucket)
         *(bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>
           **)(this + 0x10);
}

Assistant:

const_iterator find_impl(const K& key, std::size_t hash) const {
        std::size_t ibucket = bucket_for_hash(hash); 
        distance_type dist_from_ideal_bucket = 0;
        
        while(dist_from_ideal_bucket <= m_buckets[ibucket].dist_from_ideal_bucket()) {
            if((!USE_STORED_HASH_ON_LOOKUP || m_buckets[ibucket].bucket_hash_equal(hash)) && 
               compare_keys(KeySelect()(m_buckets[ibucket].value()), key)) 
            {
                return const_iterator(m_buckets.begin() + ibucket);
            }
            
            ibucket = next_bucket(ibucket);
            dist_from_ideal_bucket++;
        }
        
        return cend();
    }